

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FailoverStrategy.cpp
# Opt level: O0

void __thiscall xmrig::FailoverStrategy::resume(FailoverStrategy *this)

{
  long *plVar1;
  int iVar2;
  ulong uVar3;
  IClient *pIVar4;
  IClient *pIVar5;
  long *in_RDI;
  
  uVar3 = (**(code **)(*in_RDI + 0x10))();
  if ((uVar3 & 1) != 0) {
    plVar1 = (long *)in_RDI[4];
    pIVar4 = active((FailoverStrategy *)0x1d2d22);
    pIVar5 = active((FailoverStrategy *)0x1d2d31);
    iVar2 = (*pIVar5->_vptr_IClient[9])();
    (**(code **)(*plVar1 + 0x18))(plVar1,in_RDI,pIVar4,iVar2);
  }
  return;
}

Assistant:

void xmrig::FailoverStrategy::resume()
{
    if (!isActive()) {
        return;
    }

    m_listener->onJob(this, active(), active()->job());
}